

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  _7z_coder *p_Var4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  uchar *puVar9;
  uint64_t *puVar10;
  uint64_t *puVar11;
  uint32_t *puVar12;
  _7z_folder *p_Var13;
  _7z_coder *p_Var14;
  byte *pbVar15;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar16;
  ulong *puVar17;
  uint64_t *puVar18;
  uint64_t uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  size_t num;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  uint uVar27;
  uint uVar28;
  size_t __nmemb;
  ulong uVar29;
  bool bVar30;
  ulong local_70;
  uint64_t local_60;
  _7z_digests local_58;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar8 = header_bytes(a,1);
  if (puVar8 == (uchar *)0x0) {
    return -1;
  }
  if (*puVar8 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar6 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar6 < 0) goto LAB_00235420;
    puVar18 = &(si->pi).numPackStreams;
    iVar6 = parse_7zip_uint64(a,puVar18);
    if (((iVar6 < 0) || (*puVar18 - 0x5f5e101 < 0xfffffffffa0a1f00)) ||
       (puVar9 = header_bytes(a,1), puVar9 == (uchar *)0x0)) {
LAB_002353b9:
      bVar30 = false;
    }
    else {
      if (*puVar9 != '\0') {
        if (*puVar9 == '\t') {
          sVar26 = (si->pi).numPackStreams;
          puVar10 = (uint64_t *)calloc(sVar26,8);
          (si->pi).sizes = puVar10;
          puVar11 = (uint64_t *)calloc(sVar26,8);
          (si->pi).positions = puVar11;
          if (puVar11 != (uint64_t *)0x0 && puVar10 != (uint64_t *)0x0) {
            if (sVar26 != 0) {
              uVar25 = 1;
              uVar22 = 0;
              do {
                iVar6 = parse_7zip_uint64(a,(si->pi).sizes + uVar22);
                if (iVar6 < 0) goto LAB_002353b9;
                uVar22 = (ulong)uVar25;
                uVar25 = uVar25 + 1;
              } while (uVar22 < *puVar18);
            }
            puVar9 = header_bytes(a,1);
            if (puVar9 != (uchar *)0x0) {
              if (*puVar9 == '\n') {
                iVar6 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
                if ((-1 < iVar6) && (puVar9 = header_bytes(a,1), puVar9 != (uchar *)0x0)) {
                  bVar30 = *puVar9 != '\0';
                  goto LAB_002353b5;
                }
              }
              else if (*puVar9 == '\0') {
                sVar26 = (si->pi).numPackStreams;
                puVar9 = (uchar *)calloc(sVar26,1);
                (si->pi).digest.defineds = puVar9;
                puVar12 = (uint32_t *)calloc(sVar26,4);
                (si->pi).digest.digests = puVar12;
                bVar30 = puVar12 == (uint32_t *)0x0 || puVar9 == (uchar *)0x0;
LAB_002353b5:
                if (!bVar30) goto LAB_002353c2;
                goto LAB_002353b9;
              }
LAB_00235420:
              bVar30 = false;
              goto LAB_00235422;
            }
          }
        }
        goto LAB_002353b9;
      }
LAB_002353c2:
      puVar18 = (si->pi).positions;
      if ((puVar18 == (uint64_t *)0x0) || (puVar10 = (si->pi).sizes, puVar10 == (uint64_t *)0x0))
      goto LAB_00235420;
      if ((si->pi).numPackStreams != 0) {
        uVar22 = (si->pi).pos;
        uVar25 = 1;
        uVar20 = 0;
        do {
          puVar18[uVar20] = uVar22;
          puVar17 = puVar10 + uVar20;
          bVar30 = CARRY8(uVar22,*puVar17);
          uVar22 = uVar22 + *puVar17;
          if ((bVar30) || (*(ulong *)((long)pvVar2 + 0x80) < uVar22)) goto LAB_00235420;
          uVar20 = (ulong)uVar25;
          uVar25 = uVar25 + 1;
        } while (uVar20 < (si->pi).numPackStreams);
      }
      puVar8 = header_bytes(a,1);
      bVar30 = puVar8 != (uchar *)0x0;
    }
LAB_00235422:
    if (!bVar30) {
      return -1;
    }
  }
  if (*puVar8 == '\a') {
    (si->ci).numFolders = 0;
    (si->ci).folders = (_7z_folder *)0x0;
    (si->ci).dataStreamIndex = 0;
    local_58.defineds = (uchar *)0x0;
    local_58.digests = (uint32_t *)0x0;
    puVar9 = header_bytes(a,1);
    if ((puVar9 == (uchar *)0x0) || (*puVar9 != '\v')) {
LAB_00235995:
      free(local_58.defineds);
      free(local_58.digests);
LAB_002359ac:
      bVar30 = false;
    }
    else {
      val = &si->ci;
      iVar6 = parse_7zip_uint64(a,&val->numFolders);
      if (iVar6 < 0) goto LAB_00235995;
      if (100000000 < val->numFolders) goto LAB_002359ac;
      puVar9 = header_bytes(a,1);
      if (puVar9 == (uchar *)0x0) goto LAB_00235995;
      if (*puVar9 == '\x01') {
        puVar18 = &(si->ci).dataStreamIndex;
        iVar6 = parse_7zip_uint64(a,puVar18);
        if ((iVar6 < 0) || (100000000 < *puVar18)) goto LAB_002359ac;
        if (val->numFolders == 0) goto LAB_00235dc1;
LAB_0023597f:
        archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
        goto LAB_00235995;
      }
      if (*puVar9 != '\0') goto LAB_0023597f;
      sVar26 = (si->ci).numFolders;
      p_Var13 = (_7z_folder *)calloc(sVar26,0x68);
      (si->ci).folders = p_Var13;
      if (p_Var13 == (_7z_folder *)0x0) goto LAB_002359ac;
      if (sVar26 != 0) {
        uVar22 = 0;
        do {
          p_Var3 = (si->ci).folders;
          p_Var13 = p_Var3 + uVar22;
          local_38 = a->format->data;
          p_Var3[uVar22].numUnpackStreams = 0;
          (&p_Var3[uVar22].numUnpackStreams)[1] = 0;
          p_Var3[uVar22].unPackSize = (uint64_t *)0x0;
          (&p_Var3[uVar22].unPackSize)[1] = (uint64_t *)0x0;
          p_Var3[uVar22].numInStreams = 0;
          (&p_Var3[uVar22].numInStreams)[1] = 0;
          p_Var3[uVar22].numPackedStreams = 0;
          (&p_Var3[uVar22].numPackedStreams)[1] = 0;
          p_Var3[uVar22].numBindPairs = 0;
          (&p_Var3[uVar22].numBindPairs)[1] = 0;
          p_Var3[uVar22].numCoders = 0;
          p_Var3[uVar22].coders = (_7z_coder *)0x0;
          p_Var3[uVar22].skipped_bytes = 0;
          local_40 = uVar22;
          iVar6 = parse_7zip_uint64(a,&p_Var13->numCoders);
          if ((iVar6 < 0) || (uVar22 = p_Var13->numCoders, 4 < uVar22)) goto LAB_00235995;
          p_Var14 = (_7z_coder *)calloc(uVar22,0x28);
          p_Var13->coders = p_Var14;
          if (p_Var14 == (_7z_coder *)0x0) goto LAB_00235995;
          if (uVar22 == 0) {
            local_60 = 0;
            local_70 = 0;
          }
          else {
            uVar22 = 0;
            local_70 = 0;
            local_60 = 0;
            do {
              pbVar15 = header_bytes(a,1);
              if ((pbVar15 == (byte *)0x0) || (bVar1 = *pbVar15, (char)bVar1 < '\0')) {
LAB_0023573b:
                bVar30 = false;
              }
              else {
                puVar9 = header_bytes(a,(ulong)(bVar1 & 0xf));
                if (puVar9 == (uchar *)0x0) goto LAB_0023573b;
                if ((bVar1 & 0xf) == 0) {
                  uVar20 = 0;
                }
                else {
                  uVar23 = 0;
                  uVar20 = 0;
                  do {
                    uVar20 = uVar20 << 8 | (ulong)puVar9[uVar23];
                    uVar23 = uVar23 + 1;
                  } while ((bVar1 & 0xf) != uVar23);
                }
                p_Var4 = p_Var13->coders;
                p_Var14 = p_Var4 + uVar22;
                puVar18 = &p_Var14->numInStreams;
                p_Var14->codec = uVar20;
                if ((bVar1 & 0x10) == 0) {
                  *puVar18 = 1;
                  p_Var4[uVar22].numOutStreams = 1;
LAB_00235631:
                  if ((bVar1 & 0x20) != 0) {
                    iVar6 = parse_7zip_uint64(a,&p_Var13->coders[uVar22].propertiesSize);
                    if (-1 < iVar6) {
                      uVar20 = p_Var13->coders[uVar22].propertiesSize;
                      if (100000000 < uVar20) goto LAB_002356eb;
                      puVar9 = header_bytes(a,uVar20);
                      if (puVar9 != (uchar *)0x0) {
                        p_Var14 = p_Var13->coders;
                        __dest = (uchar *)malloc(p_Var14[uVar22].propertiesSize);
                        p_Var14[uVar22].properties = __dest;
                        if (__dest != (uchar *)0x0) {
                          memcpy(__dest,puVar9,p_Var14[uVar22].propertiesSize);
                          goto LAB_0023563b;
                        }
                      }
                    }
                    goto LAB_0023573b;
                  }
LAB_0023563b:
                  local_70 = local_70 + p_Var13->coders[uVar22].numInStreams;
                  local_60 = local_60 + p_Var13->coders[uVar22].numOutStreams;
                  bVar30 = true;
                }
                else {
                  iVar6 = parse_7zip_uint64(a,puVar18);
                  if (iVar6 < 0) goto LAB_0023573b;
                  if (p_Var13->coders[uVar22].numInStreams < 0x5f5e101) {
                    iVar6 = parse_7zip_uint64(a,&p_Var13->coders[uVar22].numOutStreams);
                    if (iVar6 < 0) goto LAB_0023573b;
                    if (p_Var13->coders[uVar22].numOutStreams < 0x5f5e101) goto LAB_00235631;
                  }
LAB_002356eb:
                  bVar30 = false;
                }
              }
              if (!bVar30) goto LAB_00235995;
              uVar22 = (ulong)((int)uVar22 + 1);
            } while (uVar22 < p_Var13->numCoders);
          }
          if (((local_60 == 0) || (sVar26 = local_60 - 1, local_70 < sVar26)) ||
             (p_Var13->numBindPairs = sVar26, *(ulong *)((long)local_38 + 0x70) < sVar26))
          goto LAB_00235995;
          if (sVar26 == 0) {
            p_Var13->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
          }
          else {
            paVar16 = (anon_struct_16_2_4d417c8e *)calloc(sVar26,0x10);
            p_Var13->bindPairs = paVar16;
            if (paVar16 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_00235995;
          }
          if (sVar26 != 0) {
            uVar22 = 0;
            uVar20 = 1;
            do {
              iVar6 = parse_7zip_uint64(a,&p_Var13->bindPairs[uVar22].inIndex);
              if (((iVar6 < 0) || (100000000 < p_Var13->bindPairs[uVar22].inIndex)) ||
                 ((iVar6 = parse_7zip_uint64(a,&p_Var13->bindPairs[uVar22].outIndex), iVar6 < 0 ||
                  (100000000 < p_Var13->bindPairs[uVar22].outIndex)))) goto LAB_00235995;
              sVar26 = p_Var13->numBindPairs;
              bVar30 = uVar20 < sVar26;
              uVar22 = uVar20;
              uVar20 = (ulong)((int)uVar20 + 1);
            } while (bVar30);
          }
          __nmemb = local_70 - sVar26;
          p_Var13->numPackedStreams = __nmemb;
          puVar17 = (ulong *)calloc(__nmemb,8);
          p_Var13->packedStreams = puVar17;
          if (puVar17 == (ulong *)0x0) goto LAB_00235995;
          if (__nmemb != 0) {
            if (__nmemb == 1) {
              if (local_70 == 0) {
                uVar22 = 0;
              }
              else {
                uVar22 = 0;
                do {
                  if (sVar26 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar25 = 1;
                    uVar20 = 0;
                    do {
                      if (p_Var13->bindPairs[uVar20].inIndex == uVar22) break;
                      uVar20 = (ulong)uVar25;
                      uVar25 = uVar25 + 1;
                    } while (uVar20 < sVar26);
                  }
                } while ((sVar26 != uVar20) &&
                        (uVar22 = (ulong)((int)uVar22 + 1), uVar22 < local_70));
              }
              if (local_70 == uVar22) goto LAB_00235995;
              *puVar17 = uVar22;
            }
            else {
              uVar25 = 1;
              uVar22 = 0;
              do {
                iVar6 = parse_7zip_uint64(a,p_Var13->packedStreams + uVar22);
                if ((iVar6 < 0) || (100000000 < p_Var13->packedStreams[uVar22])) goto LAB_00235995;
                uVar22 = (ulong)uVar25;
                uVar25 = uVar25 + 1;
              } while (uVar22 < p_Var13->numPackedStreams);
            }
          }
          p_Var13->numInStreams = local_70;
          p_Var13->numOutStreams = local_60;
          uVar22 = (ulong)((int)local_40 + 1);
        } while (uVar22 < val->numFolders);
      }
LAB_00235dc1:
      puVar9 = header_bytes(a,1);
      if ((puVar9 == (uchar *)0x0) || (*puVar9 != '\f')) goto LAB_00235995;
      if (val->numFolders != 0) {
        uVar22 = 0;
        do {
          p_Var13 = (si->ci).folders;
          sVar26 = p_Var13[uVar22].numOutStreams;
          puVar18 = (uint64_t *)calloc(sVar26,8);
          p_Var13[uVar22].unPackSize = puVar18;
          if (puVar18 == (uint64_t *)0x0) goto LAB_00235995;
          if (sVar26 != 0) {
            uVar25 = 1;
            uVar20 = 0;
            do {
              iVar6 = parse_7zip_uint64(a,p_Var13[uVar22].unPackSize + uVar20);
              if (iVar6 < 0) goto LAB_00235995;
              uVar20 = (ulong)uVar25;
              uVar25 = uVar25 + 1;
            } while (uVar20 < p_Var13[uVar22].numOutStreams);
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (uVar22 < val->numFolders);
      }
      puVar9 = header_bytes(a,1);
      if (puVar9 == (uchar *)0x0) goto LAB_00235995;
      if (*puVar9 != '\0') {
        if ((*puVar9 == '\n') && (iVar6 = read_Digests(a,&local_58,val->numFolders), -1 < iVar6)) {
          uVar22 = val->numFolders;
          if (uVar22 != 0) {
            puVar12 = &((si->ci).folders)->digest;
            uVar20 = 0;
            do {
              *(uchar *)(puVar12 + -1) = local_58.defineds[uVar20];
              *puVar12 = local_58.digests[uVar20];
              uVar20 = uVar20 + 1;
              puVar12 = puVar12 + 0x1a;
            } while ((uVar20 & 0xffffffff) < uVar22);
          }
          puVar9 = header_bytes(a,1);
          if ((puVar9 != (uchar *)0x0) && (*puVar9 == '\0')) {
            free(local_58.defineds);
            free(local_58.digests);
            goto LAB_00235f13;
          }
        }
        goto LAB_00235995;
      }
LAB_00235f13:
      uVar22 = (si->ci).numFolders;
      if (uVar22 != 0) {
        p_Var13 = (si->ci).folders;
        uVar23 = 0;
        uVar25 = 1;
        uVar20 = 0;
        do {
          uVar27 = (uint)uVar20;
          p_Var13[uVar23].packIndex = uVar27;
          uVar20 = p_Var13[uVar23].numPackedStreams;
          if (((uVar20 >> 0x20 != 0) ||
              (uVar28 = (uint)uVar20, uVar20 = (ulong)(uVar27 + uVar28), CARRY4(uVar27,uVar28))) ||
             ((si->pi).numPackStreams < uVar20)) {
            bVar30 = false;
            goto LAB_002359ae;
          }
          uVar23 = (ulong)uVar25;
          uVar25 = uVar25 + 1;
        } while (uVar23 < uVar22);
      }
      puVar8 = header_bytes(a,1);
      bVar30 = puVar8 != (uchar *)0x0;
    }
LAB_002359ae:
    if (!bVar30) {
      return -1;
    }
  }
  if (*puVar8 != '\b') goto LAB_00235da5;
  uVar22 = (si->ci).numFolders;
  p_Var13 = (si->ci).folders;
  (si->ss).unpack_streams = 0;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ss).digests = (uint32_t *)0x0;
  if (uVar22 != 0) {
    puVar18 = &p_Var13->numUnpackStreams;
    uVar20 = 1;
    do {
      *puVar18 = 1;
      puVar18 = puVar18 + 0xd;
      bVar30 = uVar20 < uVar22;
      uVar20 = (ulong)((int)uVar20 + 1);
    } while (bVar30);
  }
  puVar8 = header_bytes(a,1);
  if (puVar8 == (uchar *)0x0) {
    return -1;
  }
  uVar5 = *puVar8;
  uVar20 = uVar22;
  if (uVar5 == '\r') {
    if (uVar22 == 0) {
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      uVar23 = 0;
      uVar29 = 1;
      do {
        iVar6 = parse_7zip_uint64(a,&p_Var13[uVar23].numUnpackStreams);
        if (iVar6 < 0) {
          return -1;
        }
        uVar23 = p_Var13[uVar23].numUnpackStreams;
        if (100000000 < uVar23) {
          return -1;
        }
        if (0xfffffffffa0a1eff < uVar20) {
          return -1;
        }
        uVar20 = uVar20 + uVar23;
        bVar30 = uVar29 < uVar22;
        uVar23 = uVar29;
        uVar29 = (ulong)((int)uVar29 + 1);
      } while (bVar30);
    }
    puVar8 = header_bytes(a,1);
    if (puVar8 == (uchar *)0x0) {
      return -1;
    }
    uVar5 = *puVar8;
  }
  (si->ss).unpack_streams = uVar20;
  if (uVar20 != 0) {
    puVar18 = (uint64_t *)calloc(uVar20,8);
    (si->ss).unpackSizes = puVar18;
    puVar8 = (uchar *)calloc(uVar20,1);
    (si->ss).digestsDefined = puVar8;
    puVar12 = (uint32_t *)calloc(uVar20,4);
    (si->ss).digests = puVar12;
    if (puVar18 == (uint64_t *)0x0) {
      return -1;
    }
    if (puVar12 == (uint32_t *)0x0 || puVar8 == (uchar *)0x0) {
      return -1;
    }
  }
  if (uVar22 != 0) {
    puVar18 = (si->ss).unpackSizes;
    uVar23 = 0;
    do {
      if (p_Var13[uVar23].numUnpackStreams == 0) {
        iVar6 = 10;
      }
      else {
        if ((uVar5 == '\t') && (p_Var13[uVar23].numUnpackStreams != 1)) {
          uVar29 = 0;
          uVar24 = 2;
          do {
            iVar7 = parse_7zip_uint64(a,puVar18);
            iVar6 = 1;
            if ((iVar7 < 0) ||
               (bVar30 = CARRY8(uVar29,*puVar18), uVar29 = uVar29 + *puVar18, bVar30))
            goto LAB_00235bd8;
            puVar18 = puVar18 + 1;
            bVar30 = uVar24 < p_Var13[uVar23].numUnpackStreams;
            uVar24 = (ulong)((int)uVar24 + 1);
          } while (bVar30);
        }
        else {
          uVar29 = 0;
        }
        uVar19 = folder_uncompressed_size(p_Var13 + uVar23);
        iVar6 = 1;
        if (uVar29 <= uVar19) {
          *puVar18 = uVar19 - uVar29;
          puVar18 = puVar18 + 1;
          iVar6 = 0;
        }
      }
LAB_00235bd8:
      if ((iVar6 != 10) && (iVar6 != 0)) {
        return -1;
      }
      uVar23 = (ulong)((int)uVar23 + 1);
    } while (uVar23 < uVar22);
  }
  if (uVar5 == '\t') {
    puVar8 = header_bytes(a,1);
    if (puVar8 == (uchar *)0x0) {
      return -1;
    }
    uVar5 = *puVar8;
  }
  if (uVar20 != 0) {
    uVar23 = 0;
    do {
      (si->ss).digestsDefined[uVar23] = '\0';
      (si->ss).digests[uVar23] = 0;
      uVar23 = uVar23 + 1;
    } while ((uVar23 & 0xffffffff) < uVar20);
  }
  num = 0;
  if (uVar22 != 0) {
    puVar18 = &p_Var13->numUnpackStreams;
    uVar25 = 1;
    do {
      if ((*puVar18 != 1) || (*(uchar *)(puVar18 + -1) == '\0')) {
        num = (size_t)(uint)((int)num + (int)*puVar18);
      }
      uVar20 = (ulong)uVar25;
      puVar18 = puVar18 + 0xd;
      uVar25 = uVar25 + 1;
    } while (uVar20 < uVar22);
  }
  if (uVar5 == '\n') {
    puVar8 = (si->ss).digestsDefined;
    puVar12 = (si->ss).digests;
    local_58.defineds = (uchar *)0x0;
    local_58.digests = (uint32_t *)0x0;
    iVar6 = read_Digests(a,&local_58,num);
    if (iVar6 < 0) {
      free(local_58.defineds);
      free(local_58.digests);
LAB_00235d81:
      uVar5 = '\n';
      bVar30 = false;
    }
    else {
      if (uVar22 != 0) {
        uVar20 = 0;
        lVar21 = 0;
        do {
          if (p_Var13[uVar20].numUnpackStreams != 0) {
            if ((p_Var13[uVar20].numUnpackStreams == 1) && (p_Var13[uVar20].digest_defined != '\0'))
            {
              *puVar8 = '\x01';
              puVar8 = puVar8 + 1;
              *puVar12 = p_Var13[uVar20].digest;
              puVar12 = puVar12 + 1;
            }
            else {
              lVar21 = (long)(int)lVar21;
              uVar25 = 1;
              do {
                *puVar8 = local_58.defineds[lVar21];
                puVar8 = puVar8 + 1;
                *puVar12 = local_58.digests[lVar21];
                puVar12 = puVar12 + 1;
                lVar21 = lVar21 + 1;
                uVar23 = (ulong)uVar25;
                uVar25 = uVar25 + 1;
              } while (uVar23 < p_Var13[uVar20].numUnpackStreams);
            }
          }
          uVar20 = uVar20 + 1;
        } while ((uVar20 & 0xffffffff) < uVar22);
      }
      free(local_58.defineds);
      free(local_58.digests);
      puVar8 = header_bytes(a,1);
      if (puVar8 == (uchar *)0x0) goto LAB_00235d81;
      uVar5 = *puVar8;
      bVar30 = true;
    }
    if (!bVar30) {
      return -1;
    }
  }
  if (uVar5 != '\0') {
    return -1;
  }
  puVar8 = header_bytes(a,1);
  if (puVar8 == (uchar *)0x0) {
    return -1;
  }
LAB_00235da5:
  return -(uint)(*puVar8 != '\0');
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			if (packPos > UINT64_MAX - si->pi.sizes[i])
				return (-1);
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			if (f[i].numPackedStreams > UINT32_MAX)
				return (-1);
			if (packIndex > UINT32_MAX - (uint32_t)f[i].numPackedStreams)
				return (-1);
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}